

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

char * RRtype_to_str(int rr_type)

{
  switch(rr_type) {
  case 1:
    return "A";
  case 2:
    return "NS";
  case 3:
  case 4:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
    goto switchD_00103452_caseD_3;
  case 5:
    return "CNAME";
  case 6:
    return "SOA";
  case 0xc:
    return "PTR";
  case 0xf:
    return "MX";
  default:
    if (rr_type == 0x1c) {
      return "AAAA";
    }
switchD_00103452_caseD_3:
    return "UNKNOW";
  }
}

Assistant:

const char* RRtype_to_str(int rr_type){
  static const char buffer[120]="A\0\0\0\0"\
                                "NS\0\0\0"\
                                "CNAME"\
                                "\0SOA\0"\
                                "PTR\0\0"\
                                "MX\0\0\0"\
                                "AAAA\0"\
                                "UNKNOW";
  switch(rr_type){
    case RRTYPE_A:
      return &buffer[0];
    case RRTYPE_NS:
      return &buffer[5];
    case RRTYPE_CNAME:
      return &buffer[10];
    case RRTYPE_SOA:
      return &buffer[16];
    case RRTYPE_PTR:
      return &buffer[20];
    case RRTYPE_MX:
      return &buffer[25];
    case RRTYPE_AAAA:
      return &buffer[30];
    default:
      return &buffer[35];
  }
}